

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

size_t __thiscall mocker::ir::Interpreter::executeInst(Interpreter *this,size_t idx)

{
  int iVar1;
  pointer psVar2;
  long lVar3;
  long lVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  shared_ptr<mocker::ir::Addr> *psVar5;
  element_type *peVar6;
  size_t sz;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  int64_t iVar10;
  int64_t iVar11;
  long *plVar12;
  int64_t *piVar13;
  mapped_type *pmVar14;
  long lVar15;
  _Elt_pointer pAVar16;
  _Elt_pointer pAVar17;
  size_t unaff_RBP;
  FuncModule *pFVar18;
  shared_ptr<mocker::ir::Addr> *argReg;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  shared_ptr<mocker::ir::Addr> *reg;
  bool bVar19;
  vector<long,_std::allocator<long>_> args;
  shared_ptr<mocker::ir::Phi> phi;
  vector<long,_std::allocator<long>_> local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  shared_ptr<mocker::ir::Addr> local_48;
  
  pAVar17 = (this->ars).c.
            super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pAVar17 ==
      (this->ars).c.
      super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pAVar17 = (this->ars).c.
              super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
  }
  pFVar18 = pAVar17[-1].curFunc._M_data;
  psVar2 = (pFVar18->insts).
           super__Vector_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(pFVar18->insts).
                    super__Vector_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4) <= idx) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",idx);
LAB_00109e34:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",idx);
switchD_001093a2_default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                  ,0x25e,"std::size_t mocker::ir::Interpreter::executeInst(std::size_t)");
  }
  lVar3 = *(long *)&psVar2[idx].super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>;
  this_01._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(psVar2 + idx) + 8);
  local_50 = this_01._M_pi;
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
    }
    iVar1 = *(int *)(lVar3 + 8);
    if (iVar1 != 3) {
      if (iVar1 != 4) {
        if (iVar1 != 5) {
          if (*(int *)(lVar3 + 8) == 8) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
            }
            goto switchD_001093a2_caseD_8;
          }
          if (*(int *)(lVar3 + 8) != 6) {
            if (*(int *)(lVar3 + 8) == 9) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
              }
              goto switchD_001093a2_caseD_9;
            }
            if (*(int *)(lVar3 + 8) != 7) {
              if (*(int *)(lVar3 + 8) == 0xb) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
                }
                goto switchD_001093a2_caseD_b;
              }
              if (*(int *)(lVar3 + 8) != 10) {
                if (*(int *)(lVar3 + 8) == 0xd) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
                  }
                  goto switchD_001093a2_caseD_d;
                }
                if (*(int *)(lVar3 + 8) != 0xc) {
                  if (*(int *)(lVar3 + 8) == 0xf) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
                    }
                    goto switchD_001093a2_caseD_f;
                  }
                  if (*(int *)(lVar3 + 8) != 0xe) goto switchD_001093a2_default;
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
                  }
                  goto switchD_001093a2_caseD_e;
                }
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
                }
                pFVar18 = pAVar17[-1].curFunc._M_data;
                goto switchD_001093a2_caseD_c;
              }
              if (__libc_single_threaded == '\0') {
                LOCK();
                (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
              }
              goto switchD_001093a2_caseD_a;
            }
            if (__libc_single_threaded == '\0') {
              LOCK();
              (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
            }
            goto switchD_001093a2_caseD_7;
          }
          if (__libc_single_threaded == '\0') {
            LOCK();
            (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
          }
          goto switchD_001093a2_caseD_6;
        }
        if (__libc_single_threaded == '\0') {
          LOCK();
          (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
        }
        goto switchD_001093a2_caseD_5;
      }
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
      }
      goto switchD_001093a2_caseD_4;
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
    }
switchD_001093a2_caseD_3:
    iVar10 = readVal(this,(shared_ptr<mocker::ir::Addr> *)(lVar3 + 0x28));
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = *(pointer *)(lVar3 + 0x18);
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = *(pointer *)(lVar3 + 0x20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
      }
    }
    writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_68,iVar10);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    idx = idx + 1;
    if (this_01._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return idx;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
    goto LAB_00109b12;
  }
  switch(*(undefined4 *)(lVar3 + 8)) {
  case 3:
    goto switchD_001093a2_caseD_3;
  case 4:
switchD_001093a2_caseD_4:
    uVar8 = readVal(this,(shared_ptr<mocker::ir::Addr> *)(lVar3 + 0x30));
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = *(pointer *)(lVar3 + 0x18);
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = *(pointer *)(lVar3 + 0x20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
      }
    }
    uVar9 = ~uVar8;
    if (*(int *)(lVar3 + 0x28) == 0) {
      uVar9 = -uVar8;
    }
    writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_68,uVar9);
    break;
  case 5:
switchD_001093a2_caseD_5:
    uVar8 = readVal(this,(shared_ptr<mocker::ir::Addr> *)(lVar3 + 0x30));
    uVar9 = readVal(this,(shared_ptr<mocker::ir::Addr> *)(lVar3 + 0x40));
    switch(*(undefined4 *)(lVar3 + 0x28)) {
    case 0:
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)(lVar3 + 0x18);
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)(lVar3 + 0x20);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
        }
      }
      writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_68,uVar9 | uVar8);
      break;
    case 1:
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)(lVar3 + 0x18);
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)(lVar3 + 0x20);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
        }
      }
      writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_68,uVar9 & uVar8);
      break;
    case 2:
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)(lVar3 + 0x18);
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)(lVar3 + 0x20);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
        }
      }
      writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_68,uVar9 ^ uVar8);
      break;
    case 3:
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)(lVar3 + 0x18);
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)(lVar3 + 0x20);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
        }
      }
      writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_68,uVar8 << ((byte)uVar9 & 0x3f));
      break;
    case 4:
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)(lVar3 + 0x18);
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)(lVar3 + 0x20);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
        }
      }
      writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_68,
                     (long)uVar8 >> ((byte)uVar9 & 0x3f));
      break;
    case 5:
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)(lVar3 + 0x18);
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)(lVar3 + 0x20);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
        }
      }
      writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_68,uVar9 + uVar8);
      break;
    case 6:
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)(lVar3 + 0x18);
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)(lVar3 + 0x20);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
        }
      }
      writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_68,uVar8 - uVar9);
      break;
    case 7:
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)(lVar3 + 0x18);
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)(lVar3 + 0x20);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
        }
      }
      writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_68,uVar9 * uVar8);
      break;
    case 8:
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)(lVar3 + 0x18);
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)(lVar3 + 0x20);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
        }
      }
      writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_68,(long)uVar8 / (long)uVar9);
      break;
    case 9:
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)(lVar3 + 0x18);
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = *(pointer *)(lVar3 + 0x20);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish)->_M_use_count + 1;
        }
      }
      writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_68,(long)uVar8 % (long)uVar9);
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                    ,0x200,"std::size_t mocker::ir::Interpreter::executeInst(std::size_t)");
    }
    this_01._M_pi = local_50;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00109af7;
    goto LAB_00109af2;
  case 6:
switchD_001093a2_caseD_6:
    iVar10 = readVal(this,(shared_ptr<mocker::ir::Addr> *)(lVar3 + 0x30));
    iVar11 = readVal(this,(shared_ptr<mocker::ir::Addr> *)(lVar3 + 0x40));
    switch(*(undefined4 *)(lVar3 + 0x28)) {
    case 0:
      bVar19 = iVar10 == iVar11;
      break;
    case 1:
      bVar19 = iVar10 != iVar11;
      break;
    case 2:
      bVar19 = iVar10 < iVar11;
      break;
    case 3:
      bVar19 = iVar11 < iVar10;
      break;
    case 4:
      bVar19 = iVar10 <= iVar11;
      break;
    case 5:
      bVar19 = iVar11 <= iVar10;
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/ir-interpreter/interpreter.cpp"
                    ,0x21b,"std::size_t mocker::ir::Interpreter::executeInst(std::size_t)");
    }
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = *(pointer *)(lVar3 + 0x18);
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = *(pointer *)(lVar3 + 0x20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
      }
    }
    writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_68,(ulong)bVar19);
    break;
  case 7:
switchD_001093a2_caseD_7:
    iVar10 = readVal(this,(shared_ptr<mocker::ir::Addr> *)(lVar3 + 0x20));
    piVar13 = (int64_t *)readVal(this,(shared_ptr<mocker::ir::Addr> *)(lVar3 + 0x10));
    *piVar13 = iVar10;
    goto LAB_00109af7;
  case 8:
switchD_001093a2_caseD_8:
    plVar12 = (long *)readVal(this,(shared_ptr<mocker::ir::Addr> *)(lVar3 + 0x28));
    lVar4 = *plVar12;
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = *(pointer *)(lVar3 + 0x18);
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = *(pointer *)(lVar3 + 0x20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
      }
    }
    writeReg<long>(this,(shared_ptr<mocker::ir::Addr> *)&local_68,lVar4);
    break;
  case 9:
switchD_001093a2_caseD_9:
    pvVar7 = fastMalloc(this,8);
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = *(pointer *)(lVar3 + 0x18);
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = *(pointer *)(lVar3 + 0x20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
      }
    }
    writeReg<void*>(this,(shared_ptr<mocker::ir::Addr> *)&local_68,pvVar7);
    break;
  case 10:
switchD_001093a2_caseD_a:
    sz = readVal(this,(shared_ptr<mocker::ir::Addr> *)(lVar3 + 0x28));
    pvVar7 = fastMalloc(this,sz);
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = *(pointer *)(lVar3 + 0x18);
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = *(pointer *)(lVar3 + 0x20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
      }
    }
    writeReg<void*>(this,(shared_ptr<mocker::ir::Addr> *)&local_68,pvVar7);
    break;
  case 0xb:
switchD_001093a2_caseD_b:
    iVar10 = readVal(this,(shared_ptr<mocker::ir::Addr> *)(lVar3 + 0x18));
    lVar15 = (ulong)(iVar10 == 0) * 0x10;
    lVar4 = *(long *)(lVar3 + 0x28 + lVar15);
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x30 + lVar15);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    pFVar18 = pAVar17[-1].curFunc._M_data;
    pAVar17[-1].lastBB = pAVar17[-1].curBB;
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = *(pointer *)(lVar4 + 8);
    pAVar17[-1].curBB =
         (size_t)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
    pmVar14 = std::
              unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              ::at(&pFVar18->label2idx,(key_type *)&local_68);
    idx = *pmVar14;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    goto LAB_00109afd;
  case 0xc:
switchD_001093a2_caseD_c:
    pAVar17[-1].lastBB = pAVar17[-1].curBB;
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = *(pointer *)(*(long *)(lVar3 + 0x18) + 8);
    pAVar17[-1].curBB =
         (size_t)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
    pmVar14 = std::
              unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
              ::at(&pFVar18->label2idx,(key_type *)&local_68);
    idx = *pmVar14;
    goto LAB_00109afd;
  case 0xd:
switchD_001093a2_caseD_d:
    if (*(long *)(lVar3 + 0x18) != 0) {
      iVar10 = readVal(this,(shared_ptr<mocker::ir::Addr> *)(lVar3 + 0x18));
      pAVar16 = (this->ars).c.
                super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pAVar16 ==
          (this->ars).c.
          super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pAVar16 = (this->ars).c.
                  super__Deque_base<mocker::ir::Interpreter::ActivationRecord,_std::allocator<mocker::ir::Interpreter::ActivationRecord>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
      }
      pAVar16[-1].retVal = iVar10;
    }
    pFVar18 = pAVar17[-1].curFunc._M_data;
    idx = (long)(pFVar18->insts).
                super__Vector_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pFVar18->insts).
                super__Vector_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
    goto LAB_00109afd;
  case 0xe:
switchD_001093a2_caseD_e:
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    reg = *(shared_ptr<mocker::ir::Addr> **)(lVar3 + 0x48);
    psVar5 = *(shared_ptr<mocker::ir::Addr> **)(lVar3 + 0x50);
    if (reg != psVar5) {
      do {
        local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)readVal(this,reg);
        std::vector<long,_std::allocator<long>_>::emplace_back<long>(&local_68,(long *)&local_48);
        reg = reg + 1;
      } while (reg != psVar5);
    }
    iVar10 = executeFunc(this,(string *)(lVar3 + 0x28),&local_68);
    this_01._M_pi = local_50;
    peVar6 = *(element_type **)(lVar3 + 0x18);
    if (peVar6 != (element_type *)0x0) {
      local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x20);
      if (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar6;
      writeReg<long>(this,&local_48,iVar10);
      if (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    }
    if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    goto LAB_00109af7;
  case 0xf:
switchD_001093a2_caseD_f:
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    uVar8 = idx;
    do {
      idx = uVar8;
      pFVar18 = pAVar17[-1].curFunc._M_data;
      psVar2 = (pFVar18->insts).
               super__Vector_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pFVar18->insts).
                        super__Vector_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4) <= idx)
      goto LAB_00109e34;
      local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)
            &psVar2[idx].super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>;
      if (*(int *)&local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   [1]._vptr_Addr == 0xf) {
        local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(psVar2 + idx) + 8);
        if (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
            if (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) goto LAB_00109cf4;
          }
          else {
            (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count =
                 (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        std::
        vector<std::shared_ptr<mocker::ir::Phi>,std::allocator<std::shared_ptr<mocker::ir::Phi>>>::
        emplace_back<std::shared_ptr<mocker::ir::Phi>>
                  ((vector<std::shared_ptr<mocker::ir::Phi>,std::allocator<std::shared_ptr<mocker::ir::Phi>>>
                    *)&local_68,(shared_ptr<mocker::ir::Phi> *)&local_48);
        uVar8 = idx + 1;
        bVar19 = false;
        idx = unaff_RBP;
      }
      else {
        local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_00109cf4:
        bVar19 = true;
        executePhis(this,(vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
                          *)&local_68);
        uVar8 = idx;
      }
      if (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      this_01._M_pi = local_50;
      unaff_RBP = idx;
    } while (!bVar19);
    std::
    vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>::
    ~vector((vector<std::shared_ptr<mocker::ir::Phi>,_std::allocator<std::shared_ptr<mocker::ir::Phi>_>_>
             *)&local_68);
    goto LAB_00109afd;
  default:
    goto switchD_001093a2_default;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00109af2:
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
LAB_00109af7:
  idx = idx + 1;
LAB_00109afd:
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
LAB_00109b12:
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
  }
  return idx;
}

Assistant:

std::size_t Interpreter::executeInst(std::size_t idx) {
  auto &ar = ars.top();
  auto inst = ar.curFunc.get().insts.at(idx);
#ifdef PRINT_LOG
  std::cerr << fmtInst(inst) << std::endl;
#endif
  auto &func = ar.curFunc;
  if (auto p = dyc<Assign>(inst)) {
    auto operand = readVal(p->getOperand());
    writeReg(p->getDest(), operand);
    return idx + 1;
  }
  if (auto p = dyc<ArithUnaryInst>(inst)) {
    auto operand = readVal(p->getOperand());
    writeReg(p->getDest(),
             p->getOp() == ArithUnaryInst::OpType::Neg ? -operand : ~operand);
    return idx + 1;
  }
  if (auto p = dyc<ArithBinaryInst>(inst)) {
    auto lhs = readVal(p->getLhs()), rhs = readVal(p->getRhs());
    switch (p->getOp()) {
    case ArithBinaryInst::BitOr:
      writeReg(p->getDest(), lhs | rhs);
      break;
    case ArithBinaryInst::BitAnd:
      writeReg(p->getDest(), lhs & rhs);
      break;
    case ArithBinaryInst::Xor:
      writeReg(p->getDest(), lhs ^ rhs);
      break;
    case ArithBinaryInst::Shl:
      writeReg(p->getDest(), lhs << rhs);
      break;
    case ArithBinaryInst::Shr:
      writeReg(p->getDest(), lhs >> rhs);
      break;
    case ArithBinaryInst::Add:
      writeReg(p->getDest(), lhs + rhs);
      break;
    case ArithBinaryInst::Sub:
      writeReg(p->getDest(), lhs - rhs);
      break;
    case ArithBinaryInst::Mul:
      writeReg(p->getDest(), lhs * rhs);
      break;
    case ArithBinaryInst::Div:
      writeReg(p->getDest(), lhs / rhs);
      break;
    case ArithBinaryInst::Mod:
      writeReg(p->getDest(), lhs % rhs);
      break;
    default:
      assert(false);
    }
    return idx + 1;
  }
  if (auto p = dyc<RelationInst>(inst)) {
    auto lhs = readVal(p->getLhs()), rhs = readVal(p->getRhs());
    std::int64_t res;
    switch (p->getOp()) {
    case RelationInst::Eq:
      res = lhs == rhs;
      break;
    case RelationInst::Ne:
      res = lhs != rhs;
      break;
    case RelationInst::Lt:
      res = lhs < rhs;
      break;
    case RelationInst::Gt:
      res = lhs > rhs;
      break;
    case RelationInst::Le:
      res = lhs <= rhs;
      break;
    case RelationInst::Ge:
      res = lhs >= rhs;
      break;
    default:
      assert(false);
    }
    writeReg(p->getDest(), res);
    return idx + 1;
  }
  if (auto p = dyc<Load>(inst)) {
    auto addr = reinterpret_cast<std::int64_t *>(readVal(p->getAddr()));
    auto val = *addr;
    writeReg(p->getDest(), val);
    return idx + 1;
  }
  if (auto p = dyc<Store>(inst)) {
    std::int64_t val = readVal(p->getVal());
    auto addr = reinterpret_cast<std::int64_t *>(readVal(p->getAddr()));
    *addr = val;
    printLog((std::int64_t)addr, val);
    return idx + 1;
  }
  if (auto p = dyc<Alloca>(inst)) {
    auto res = fastMalloc(8);
    writeReg(p->getDest(), res);
    return idx + 1;
  }
  if (auto p = dyc<Malloc>(inst)) {
    auto sz = (std::size_t)readVal(p->getSize());
    auto res = fastMalloc(sz);
    writeReg(p->getDest(), res);
    return idx + 1;
  }
  if (auto p = dyc<Branch>(inst)) {
    auto condition = readVal(p->getCondition());
    auto nxtLabel = condition ? p->getThen() : p->getElse();
    ar.lastBB = ar.curBB;
    ar.curBB = nxtLabel->getID();
    return func.get().label2idx.at(nxtLabel->getID());
  }
  if (auto p = dyc<Jump>(inst)) {
    ar.lastBB = ar.curBB;
    ar.curBB = p->getLabel()->getID();
    return func.get().label2idx.at(p->getLabel()->getID());
  }
  if (auto p = dyc<Ret>(inst)) {
    if (p->getVal())
      ars.top().retVal = readVal(p->getVal());
    return func.get().insts.size();
  }
  if (auto p = dyc<Call>(inst)) {
    std::vector<std::int64_t> args;
    for (auto &argReg : p->getArgs())
      args.emplace_back(readVal(argReg));
    auto val = executeFunc(p->getFuncName(), args);
    if (p->getDest())
      writeReg(p->getDest(), val);
    return idx + 1;
  }
  if (auto p = dyc<Phi>(inst)) {
    std::vector<std::shared_ptr<Phi>> phis;
    while (true) {
      auto phi = dyc<Phi>(ar.curFunc.get().insts.at(idx));
      if (!phi) {
        executePhis(phis);
        return idx;
      }
      phis.emplace_back(std::move(phi));
      ++idx;
    }
  }
  assert(false);
}